

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O3

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
::flush_output(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)0,_(CPU::MOS6502Esque::Type)1>
               *this,int outputs)

{
  HalfCycles *pHVar1;
  Cycles CVar2;
  VIAPortHandler *this_00;
  long lVar3;
  
  if (((outputs & 1U) != 0) && ((this->video_).is_flushed_ == false)) {
    (this->video_).is_flushed_ = true;
    (this->video_).did_flush_ = true;
    CVar2.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
    (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
    VideoOutput::run_for(&(this->video_).object_,CVar2);
  }
  if ((outputs & 2U) != 0) {
    this_00 = (this->via_).bus_handler_;
    lVar3 = (this->via_).time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_;
    (this->via_).time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_ = 0;
    pHVar1 = &this_00->cycles_since_ay_update_;
    (pHVar1->super_WrappedInt<HalfCycles>).length_ =
         (pHVar1->super_WrappedInt<HalfCycles>).length_ + lVar3;
    VIAPortHandler::flush(this_00);
  }
  if ((this->diskii_).is_flushed_ != false) {
    return;
  }
  (this->diskii_).is_flushed_ = true;
  (this->diskii_).did_flush_ = true;
  CVar2.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)(this->diskii_).time_since_update_.super_WrappedInt<Cycles>.length_;
  (this->diskii_).time_since_update_.super_WrappedInt<Cycles>.length_ = 0;
  Apple::DiskII::run_for(&(this->diskii_).object_,CVar2);
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Video) {
				video_.flush();
			}
			if(outputs & Output::Audio) {
				via_.flush();
			}
			diskii_.flush();
		}